

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

bool __thiscall pybind11::iterator::operator!=(iterator *this,iterator *it)

{
  PyObject *pPVar1;
  iterator *self_1;
  iterator *self;
  
  if ((it->ready == false) && ((it->super_object).super_handle.m_ptr != (PyObject *)0x0)) {
    advance(it);
    it->ready = true;
  }
  pPVar1 = (it->value).super_handle.m_ptr;
  if ((this->ready == false) && ((this->super_object).super_handle.m_ptr != (PyObject *)0x0)) {
    advance(this);
    this->ready = true;
  }
  return pPVar1 != (this->value).super_handle.m_ptr;
}

Assistant:

handle operator*() const {
        if (!ready && m_ptr) {
            auto& self = const_cast<iterator &>(*this);
            self.advance();
            self.ready = true;
        }
        return value;
    }